

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool anon_unknown.dwarf_775ed::lexico_compare_3d(double *x,double *y)

{
  bool bVar1;
  
  bVar1 = true;
  if (*y <= *x) {
    if (*x <= *y) {
      if (x[1] < y[1]) {
        return true;
      }
      if (x[1] <= y[1]) {
        return x[2] <= y[2] && y[2] != x[2];
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lexico_compare_3d(const double* x, const double* y) {
	if(x[0] < y[0]) {
	    return true;
	}
	if(x[0] > y[0]) {
	    return false;
	}
	if(x[1] < y[1]) {
	    return true;
	}
	if(x[1] > y[1]) {
	    return false;
	}
	return x[2] < y[2];
    }